

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.hpp
# Opt level: O0

void __thiscall Array<String>::reserve(Array<String> *this,usize size)

{
  String *pSVar1;
  String *pSVar2;
  String *end;
  String *src;
  String *dest;
  String *newData;
  usize size_local;
  Array<String> *this_local;
  
  if ((this->_capacity < size) || (((this->_begin).item == (String *)0x0 && (size != 0)))) {
    if (this->_capacity < size) {
      this->_capacity = size;
    }
    this->_capacity = this->_capacity | 3;
    pSVar2 = (String *)operator_new__(this->_capacity * 0x28);
    src = pSVar2;
    if ((this->_begin).item != (String *)0x0) {
      pSVar1 = (this->_end).item;
      for (end = (this->_begin).item; end != pSVar1; end = end + 1) {
        String::String(src,end);
        String::~String(end);
        src = src + 1;
      }
      pSVar1 = (this->_begin).item;
      if (pSVar1 != (String *)0x0) {
        operator_delete__(pSVar1);
      }
    }
    (this->_begin).item = pSVar2;
    (this->_end).item = src;
  }
  return;
}

Assistant:

void reserve(usize size)
  {
    if(size > _capacity || (!_begin.item && size > 0))
    {
      if (size > _capacity)
        _capacity = size;
      _capacity |= 0x03;
      T* newData = (T*)new char[sizeof(T) * _capacity];
      T* dest = newData;
      if(_begin.item)
      {
        for (T* src = _begin.item, * end = _end.item; src != end; ++src, ++dest)
        {
#ifdef VERIFY
          VERIFY(new(dest)T(*src) == dest);
#else
          new(dest)T(*src);
#endif
          src->~T();
        }
        delete[] (char*)_begin.item;
      }
      _begin.item = newData;
      _end.item = dest;
    }
  }